

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerHLSL::emit_header(CompilerHLSL *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *header;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts;
  long lVar1;
  
  ts = (this->super_CompilerGLSL).header_lines.
       super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .ptr;
  for (lVar1 = (this->super_CompilerGLSL).header_lines.
               super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .buffer_size << 5; lVar1 != 0; lVar1 = lVar1 + -0x20) {
    CompilerGLSL::statement<std::__cxx11::string&>(&this->super_CompilerGLSL,ts);
    ts = ts + 1;
  }
  if ((this->super_CompilerGLSL).header_lines.
      super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .buffer_size != 0) {
    CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x303078);
    return;
  }
  return;
}

Assistant:

void CompilerHLSL::emit_header()
{
	for (auto &header : header_lines)
		statement(header);

	if (header_lines.size() > 0)
	{
		statement("");
	}
}